

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase455::run(TestCase455 *this)

{
  bool bVar1;
  int *piVar2;
  AddFailureAdapter local_140;
  int *local_128;
  int *local_120;
  bool local_111;
  int *piStack_110;
  bool _kj_shouldLog_1;
  int *local_108;
  int *local_100;
  undefined1 local_f8 [8];
  DebugComparison<int_*,_const_int_*> _kjCondition_1;
  int *i2_1;
  int *_i2472;
  Maybe<const_int_&> cmci2;
  Maybe<const_int_&> cmci;
  Maybe<const_int_&> mci;
  int *local_90;
  int *local_88;
  bool local_79;
  int *piStack_78;
  bool _kj_shouldLog;
  int *local_70;
  int *local_68;
  undefined1 local_60 [8];
  DebugComparison<int_*,_int_*> _kjCondition;
  int *i2;
  int *_i2462;
  Maybe<int_&> cmi;
  Maybe<int_&> mi;
  int i;
  TestCase455 *this_local;
  
  Maybe<int_&>::Maybe(&cmi,(int *)((long)&mi.ptr + 4));
  Maybe<int_&>::Maybe((Maybe<int_&> *)&_i2462,&cmi);
  piVar2 = kj::_::readMaybe<int>((Maybe<int_&> *)&_i2462);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&mci,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x1d1);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&mci);
  }
  else {
    local_70 = (int *)((long)&mi.ptr + 4);
    _kjCondition._32_8_ = piVar2;
    local_68 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
    piStack_78 = (int *)_kjCondition._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_60,(DebugExpression<int*> *)&local_68,
               &stack0xffffffffffffff88);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      local_79 = kj::_::Debug::shouldLog(ERROR);
      while (local_79 != false) {
        local_88 = (int *)((long)&mi.ptr + 4);
        local_90 = (int *)_kjCondition._32_8_;
        kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x1cf,ERROR,"\"failed: expected \" \"(&i) == (&i2)\", _kjCondition, &i, &i2",
                   (char (*) [31])"failed: expected (&i) == (&i2)",
                   (DebugComparison<int_*,_int_*> *)local_60,&local_88,&local_90);
        local_79 = false;
      }
    }
  }
  Maybe<const_int_&>::Maybe<int>(&cmci,&cmi);
  Maybe<int_const&>::Maybe<int_const>((Maybe<int_const&> *)&cmci2,&cmci);
  Maybe<const_int_&>::Maybe((Maybe<const_int_&> *)&_i2472,&cmci2);
  _kjCondition_1._32_8_ = kj::_::readMaybe<int_const>((Maybe<const_int_&> *)&_i2472);
  if ((int *)_kjCondition_1._32_8_ == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x1db);
    AddFailureAdapter::~AddFailureAdapter(&local_140);
  }
  else {
    local_108 = (int *)((long)&mi.ptr + 4);
    local_100 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_108);
    piStack_110 = (int *)_kjCondition_1._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_const_int_*> *)local_f8,(DebugExpression<int*> *)&local_100,
               &stack0xfffffffffffffef0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
    if (!bVar1) {
      local_111 = kj::_::Debug::shouldLog(ERROR);
      while (local_111 != false) {
        local_120 = (int *)((long)&mi.ptr + 4);
        local_128 = (int *)_kjCondition_1._32_8_;
        kj::_::Debug::
        log<char_const(&)[31],kj::_::DebugComparison<int*,int_const*>&,int*,int_const*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x1d9,ERROR,"\"failed: expected \" \"(&i) == (&i2)\", _kjCondition, &i, &i2",
                   (char (*) [31])"failed: expected (&i) == (&i2)",
                   (DebugComparison<int_*,_const_int_*> *)local_f8,&local_120,&local_128);
        local_111 = false;
      }
    }
  }
  return;
}

Assistant:

TEST(Common, MaybeConstness) {
  int i;

  Maybe<int&> mi = i;
  const Maybe<int&> cmi = mi;
//  const Maybe<int&> cmi2 = cmi;    // shouldn't compile!  Transitive const violation.

  KJ_IF_SOME(i2, cmi) {
    EXPECT_EQ(&i, &i2);
  } else {
    ADD_FAILURE();
  }